

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jutils.c
# Opt level: O0

void jcopy_sample_rows(JSAMPARRAY input_array,int source_row,JSAMPARRAY output_array,int dest_row,
                      int num_rows,JDIMENSION num_cols)

{
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  uint in_R9D;
  int row;
  size_t count;
  JSAMPROW outptr;
  JSAMPROW inptr;
  int local_44;
  undefined8 *local_18;
  undefined8 *local_8;
  
  local_18 = (undefined8 *)(in_RDX + (long)in_ECX * 8);
  local_8 = (undefined8 *)(in_RDI + (long)in_ESI * 8);
  for (local_44 = in_R8D; 0 < local_44; local_44 = local_44 + -1) {
    memcpy((void *)*local_18,(void *)*local_8,(ulong)in_R9D);
    local_18 = local_18 + 1;
    local_8 = local_8 + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jcopy_sample_rows (JSAMPARRAY input_array, int source_row,
		   JSAMPARRAY output_array, int dest_row,
		   int num_rows, JDIMENSION num_cols)
/* Copy some rows of samples from one place to another.
 * num_rows rows are copied from input_array[source_row++]
 * to output_array[dest_row++]; these areas may overlap for duplication.
 * The source and destination arrays must be at least as wide as num_cols.
 */
{
  register JSAMPROW inptr, outptr;
#ifdef FMEMCOPY
  register size_t count = (size_t) (num_cols * SIZEOF(JSAMPLE));
#else
  register JDIMENSION count;
#endif
  register int row;

  input_array += source_row;
  output_array += dest_row;

  for (row = num_rows; row > 0; row--) {
    inptr = *input_array++;
    outptr = *output_array++;
#ifdef FMEMCOPY
    FMEMCOPY(outptr, inptr, count);
#else
    for (count = num_cols; count > 0; count--)
      *outptr++ = *inptr++;	/* needn't bother with GETJSAMPLE() here */
#endif
  }
}